

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_common.cpp
# Opt level: O2

void __thiscall
cfdcapi_common_CfdCloneHandle_Test::cfdcapi_common_CfdCloneHandle_Test
          (cfdcapi_common_CfdCloneHandle_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0064f270;
  return;
}

Assistant:

TEST(cfdcapi_common, CfdCloneHandle) {
  cfd::Initialize();
  int ret = CfdCloneHandle(NULL, NULL);
  EXPECT_EQ(kCfdIllegalArgumentError, ret);

  void* handle = NULL;
  ret = CfdCloneHandle(NULL, &handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  void* handle2 = NULL;
  ret = CfdCloneHandle(handle, &handle2);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle2));

  ret = CfdCopyErrorState(handle, handle2);
  EXPECT_EQ(kCfdSuccess, ret);

  ret = CfdFreeHandle(handle2);
  EXPECT_EQ(kCfdSuccess, ret);

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}